

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractfileengine.cpp
# Opt level: O1

void __thiscall
QAbstractFileEngineHandler::QAbstractFileEngineHandler(QAbstractFileEngineHandler *this)

{
  QPodArrayOps<QAbstractFileEngineHandler*> *this_00;
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_fileEngineHandlers>_> *this_01;
  long in_FS_OFFSET;
  QWriteLocker locker;
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_fileEngineHandlers>_> *local_20;
  QAbstractFileEngineHandler *local_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  this->_vptr_QAbstractFileEngineHandler = (_func_int **)&PTR__QAbstractFileEngineHandler_006a71c0;
  this_01 = (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_fileEngineHandlers>_>
             *)this;
  local_20 = (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_fileEngineHandlers>_>
              *)QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_fileEngineHandlerMutex>_>
                ::operator()((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_fileEngineHandlerMutex>_>
                              *)this);
  if (((ulong)local_20 & 1) == 0 &&
      local_20 !=
      (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_fileEngineHandlers>_> *)0x0
     ) {
    this_01 = local_20;
    QReadWriteLock::lockForWrite((QReadWriteLock *)local_20);
    local_20 = (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_fileEngineHandlers>_>
                *)((ulong)local_20 | 1);
  }
  qt_file_engine_handlers_in_use._q_value.super___atomic_base<int>._M_i =
       (Type)(__atomic_base<int>)0x1;
  this_00 = (QPodArrayOps<QAbstractFileEngineHandler*> *)
            QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_fileEngineHandlers>_>
            ::operator()(this_01);
  local_18 = this;
  QtPrivate::QPodArrayOps<QAbstractFileEngineHandler*>::emplace<QAbstractFileEngineHandler*&>
            (this_00,0,&local_18);
  if (((ulong)local_20 & 1) != 0) {
    QReadWriteLock::unlock((QReadWriteLock *)((ulong)local_20 & 0xfffffffffffffffe));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QAbstractFileEngineHandler::QAbstractFileEngineHandler()
{
    QWriteLocker locker(fileEngineHandlerMutex());
    qt_file_engine_handlers_in_use.storeRelaxed(true);
    fileEngineHandlers()->prepend(this);
}